

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_trans_double_path.cpp
# Opt level: O3

void __thiscall agg::trans_double_path::move_to1(trans_double_path *this,double x,double y)

{
  uint uVar1;
  vertex_dist local_20;
  
  local_20.x = x;
  local_20.y = y;
  if (this->m_status1 == making_path) {
    local_20.dist = 0.0;
    vertex_sequence<agg::vertex_dist,_6U>::add(&this->m_src_vertices1,&local_20);
  }
  else if (this->m_status1 == initial) {
    local_20.dist = 0.0;
    uVar1 = (this->m_src_vertices1).super_pod_bvector<agg::vertex_dist,_6U>.m_size;
    if (uVar1 != 0) {
      (this->m_src_vertices1).super_pod_bvector<agg::vertex_dist,_6U>.m_size = uVar1 - 1;
    }
    vertex_sequence<agg::vertex_dist,_6U>::add(&this->m_src_vertices1,&local_20);
    this->m_status1 = making_path;
  }
  return;
}

Assistant:

void trans_double_path::move_to1(double x, double y)
    {
        if(m_status1 == initial)
        {
            m_src_vertices1.modify_last(vertex_dist(x, y));
            m_status1 = making_path;
        }
        else
        {
            line_to1(x, y);
        }
    }